

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

bool __thiscall
ON_Annotation::Internal_GetBBox_Begin
          (ON_Annotation *this,ON_SHA1_Hash *hash,double *boxmin,double *boxmax,bool bGrow)

{
  double dVar1;
  undefined1 local_c8 [7];
  bool rc;
  ON_BoundingBox cached_bbox;
  double local_90;
  double local_88;
  ON_3dPoint local_80;
  undefined1 local_68 [8];
  ON_BoundingBox bbox;
  bool bGrow_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_SHA1_Hash *hash_local;
  ON_Annotation *this_local;
  
  bbox.m_max.z._7_1_ = bGrow;
  memcpy(local_68,&ON_BoundingBox::NanBoundingBox,0x30);
  dVar1 = ON_DBL_QNAN;
  if ((boxmin == (double *)0x0) || (boxmax == (double *)0x0)) {
    if (boxmin != (double *)0x0) {
      boxmin[2] = ON_DBL_QNAN;
      boxmin[1] = dVar1;
      *boxmin = dVar1;
    }
    dVar1 = ON_DBL_QNAN;
    if (boxmax != (double *)0x0) {
      boxmax[2] = ON_DBL_QNAN;
      boxmax[1] = dVar1;
      *boxmax = dVar1;
    }
    this_local._7_1_ = false;
  }
  else {
    if ((bbox.m_max.z._7_1_ & 1) != 0) {
      ON_3dPoint::ON_3dPoint(&local_80,boxmin);
      local_68 = (undefined1  [8])local_80.x;
      bbox.m_min.x = local_80.y;
      bbox.m_min.y = local_80.z;
      ON_3dPoint::ON_3dPoint((ON_3dPoint *)&cached_bbox.m_max.z,boxmax);
      bbox.m_min.z = cached_bbox.m_max.z;
      bbox.m_max.x = local_90;
      bbox.m_max.y = local_88;
      bbox.m_max.z._7_1_ = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_68);
    }
    if ((bbox.m_max.z._7_1_ & 1) == 0) {
      memcpy(local_68,&ON_BoundingBox::EmptyBoundingBox,0x30);
    }
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_c8);
    this_local._7_1_ =
         ON_BoundingBoxCache::GetBoundingBox(&this->m_bbox_cache,hash,(ON_BoundingBox *)local_c8);
    if (this_local._7_1_) {
      if ((bbox.m_max.z._7_1_ & 1) == 0) {
        memcpy(local_68,local_c8,0x30);
      }
      else {
        ON_BoundingBox::Union((ON_BoundingBox *)local_68,(ON_BoundingBox *)local_c8);
      }
    }
    *boxmin = (double)local_68;
    boxmin[1] = bbox.m_min.x;
    boxmin[2] = bbox.m_min.y;
    *boxmax = bbox.m_min.z;
    boxmax[1] = bbox.m_max.x;
    boxmax[2] = bbox.m_max.y;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Annotation::Internal_GetBBox_Begin(
  const ON_SHA1_Hash& hash,
  double* boxmin,
  double* boxmax,
  bool bGrow
) const
{
  ON_BoundingBox bbox = ON_BoundingBox::NanBoundingBox;
  if (nullptr != boxmin && nullptr != boxmax)
  {
    if (bGrow)
    {
      bbox.m_min = ON_3dPoint(boxmin);
      bbox.m_max = ON_3dPoint(boxmax);
      bGrow = bbox.IsNotEmpty();
    }
    if (false == bGrow)
      bbox = ON_BoundingBox::EmptyBoundingBox;
    ON_BoundingBox cached_bbox;
    const bool rc = m_bbox_cache.GetBoundingBox(hash, cached_bbox);
    if (rc)
    {
      if (bGrow)
        bbox.Union(cached_bbox);
      else
        bbox = cached_bbox;
    }
    boxmin[0] = bbox.m_min.x;
    boxmin[1] = bbox.m_min.y;
    boxmin[2] = bbox.m_min.z;
    boxmax[0] = bbox.m_max.x;
    boxmax[1] = bbox.m_max.y;
    boxmax[2] = bbox.m_max.z;
    return rc;
  }

  if (nullptr != boxmin)
  {
    boxmin[0] = boxmin[1] = boxmin[2] = ON_DBL_QNAN;
  }
  if (nullptr != boxmax)
  {
    boxmax[0] = boxmax[1] = boxmax[2] = ON_DBL_QNAN;
  }

  return false;
}